

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall sznet::TimerQueue::cancelInLoop(TimerQueue *this,TimerId timerId)

{
  TimerQueue *pTVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  size_type sVar5;
  _Self local_40;
  _Self local_38;
  iterator it;
  ActiveTimer timer;
  TimerQueue *this_local;
  TimerId timerId_local;
  
  timerId_local.m_timer = (Timer *)timerId.m_sequence;
  this_local = (TimerQueue *)timerId.m_timer;
  sznet::net::EventLoop::assertInLoopThread(this->m_loop);
  uVar3 = MinHeap<sznet::Timer>::size(&this->m_timerMinHeap);
  sVar5 = std::
          set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
          ::size(&this->m_activeTimers);
  if (uVar3 != sVar5) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x50,"void sznet::TimerQueue::cancelInLoop(TimerId)");
  }
  std::pair<sznet::Timer_*,_long>::pair<sznet::Timer_*&,_long_&,_true>
            ((pair<sznet::Timer_*,_long> *)&it,(Timer **)&this_local,(long *)&timerId_local);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
       ::find(&this->m_activeTimers,(key_type *)&it);
  local_40._M_node =
       (_Base_ptr)
       std::
       set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
       ::end(&this->m_activeTimers);
  bVar2 = std::operator!=(&local_38,&local_40);
  if (bVar2) {
    iVar4 = MinHeap<sznet::Timer>::erase(&this->m_timerMinHeap,(Timer *)this_local);
    pTVar1 = this_local;
    if (iVar4 != 0) {
      __assert_fail("m_timerMinHeap.erase(timerId.m_timer) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                    ,0x55,"void sznet::TimerQueue::cancelInLoop(TimerId)");
    }
    if (this_local != (TimerQueue *)0x0) {
      Timer::~Timer((Timer *)this_local);
      operator_delete(pTVar1);
    }
    this_local = (TimerQueue *)0x0;
    std::
    set<std::pair<sznet::Timer*,long>,std::less<std::pair<sznet::Timer*,long>>,std::allocator<std::pair<sznet::Timer*,long>>>
    ::erase_abi_cxx11_((set<std::pair<sznet::Timer*,long>,std::less<std::pair<sznet::Timer*,long>>,std::allocator<std::pair<sznet::Timer*,long>>>
                        *)&this->m_activeTimers,(const_iterator)local_38._M_node);
  }
  uVar3 = MinHeap<sznet::Timer>::size(&this->m_timerMinHeap);
  sVar5 = std::
          set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
          ::size(&this->m_activeTimers);
  if (uVar3 != sVar5) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x5c,"void sznet::TimerQueue::cancelInLoop(TimerId)");
  }
  return;
}

Assistant:

void TimerQueue::cancelInLoop(TimerId timerId)
{
	m_loop->assertInLoopThread();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	ActiveTimer timer(timerId.m_timer, timerId.m_sequence);
	ActiveTimerSet::iterator it = m_activeTimers.find(timer);
	if (it != m_activeTimers.end())
	{
		assert(m_timerMinHeap.erase(timerId.m_timer) == 0);
		// FIXME move to a free list
		// FIXME: no delete please
		delete timerId.m_timer;
		timerId.m_timer = nullptr;
		m_activeTimers.erase(it);
	}
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}